

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxMorphMaterialOffset::PmxMorphMaterialOffset(PmxMorphMaterialOffset *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  PmxMorphMaterialOffset *this_local;
  
  PmxMorphOffset::PmxMorphOffset(&this->super_PmxMorphOffset);
  (this->super_PmxMorphOffset)._vptr_PmxMorphOffset = (_func_int **)&PTR_Read_01018cf0;
  this->specularity = 0.0;
  this->edge_size = 0.0;
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    this->specular[local_14] = 0.0;
    this->ambient[local_14] = 0.0;
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    this->diffuse[local_18] = 0.0;
    this->edge_color[local_18] = 0.0;
    this->texture_argb[local_18] = 0.0;
    this->sphere_texture_argb[local_18] = 0.0;
    this->toon_texture_argb[local_18] = 0.0;
  }
  return;
}

Assistant:

PmxMorphMaterialOffset()
			: specularity(0.0f)
			, edge_size(0.0f)
		{
			for (int i = 0; i < 3; ++i) {
				specular[i] = 0.0f;
				ambient[i] = 0.0f;
			}
			for (int i = 0; i < 4; ++i) {
				diffuse[i] = 0.0f;
				edge_color[i] = 0.0f;
				texture_argb[i] = 0.0f;
				sphere_texture_argb[i] = 0.0f;
				toon_texture_argb[i] = 0.0f;
			}
		}